

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

void DrawCircleSector(Vector2 center,float radius,float startAngle,float endAngle,int segments,
                     Color color)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 local_74;
  undefined4 local_58;
  undefined4 uStack_54;
  
  fVar7 = (float)(~-(uint)(0.0 < radius) & 0x3dcccccd | (uint)radius & -(uint)(0.0 < radius));
  local_74 = endAngle;
  if (startAngle <= endAngle) {
    local_74 = startAngle;
    startAngle = endAngle;
  }
  fVar4 = startAngle - local_74;
  fVar5 = ceilf(fVar4 / 90.0);
  if (segments < (int)fVar5) {
    fVar6 = -0.5 / fVar7 + 1.0;
    fVar6 = fVar6 * fVar6;
    fVar6 = acosf(fVar6 + fVar6 + -1.0);
    fVar6 = ceilf(6.2831855 / fVar6);
    uVar1 = (uint)((fVar6 * fVar4) / 360.0);
    segments = (int)fVar5;
    if (0 < (int)uVar1) {
      segments = uVar1;
    }
  }
  fVar4 = fVar4 / (float)segments;
  rlCheckRenderBatchLimit(segments * 2);
  rlSetTexture(texShapes.id);
  rlBegin(7);
  uStack_54 = center.y;
  uVar3 = 0;
  if (0 < (int)((long)segments / 2)) {
    uVar3 = (long)segments / 2 & 0xffffffff;
  }
  while( true ) {
    iVar2 = (int)uVar3;
    uVar3 = (ulong)(iVar2 - 1);
    local_58 = center.x;
    if (iVar2 == 0) break;
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
    rlVertex2f(local_58,uStack_54);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar5 = sinf(local_74 * 0.017453292);
    fVar6 = cosf(local_74 * 0.017453292);
    rlVertex2f(fVar5 * fVar7 + local_58,fVar6 * fVar7 + uStack_54);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar5 = (fVar4 + local_74) * 0.017453292;
    fVar6 = sinf(fVar5);
    fVar5 = cosf(fVar5);
    rlVertex2f(fVar6 * fVar7 + local_58,fVar5 * fVar7 + uStack_54);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 texShapesRec.y / (float)texShapes.height);
    local_74 = local_74 + fVar4 + fVar4;
    fVar5 = sinf(local_74 * 0.017453292);
    fVar6 = cosf(local_74 * 0.017453292);
    rlVertex2f(fVar5 * fVar7 + local_58,fVar6 * fVar7 + uStack_54);
  }
  if ((segments & 1U) != 0) {
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
    rlVertex2f(local_58,uStack_54);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar5 = sinf(local_74 * 0.017453292);
    fVar6 = cosf(local_74 * 0.017453292);
    rlVertex2f(fVar5 * fVar7 + local_58,fVar6 * fVar7 + uStack_54);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar4 = (fVar4 + local_74) * 0.017453292;
    fVar5 = sinf(fVar4);
    fVar4 = cosf(fVar4);
    rlVertex2f(fVar5 * fVar7 + local_58,fVar7 * fVar4 + uStack_54);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 texShapesRec.y / (float)texShapes.height);
    rlVertex2f(local_58,uStack_54);
  }
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawCircleSector(Vector2 center, float radius, float startAngle, float endAngle, int segments, Color color)
{
    if (radius <= 0.0f) radius = 0.1f;  // Avoid div by zero

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlCheckRenderBatchLimit(4*segments/2);

    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        // NOTE: Every QUAD actually represents two segments
        for (int i = 0; i < segments/2; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength*2))*radius, center.y + cosf(DEG2RAD*(angle + stepLength*2))*radius);

            angle += (stepLength*2);
        }

        // NOTE: In case number of segments is odd, we add one last piece to the cake
        if (segments%2)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x, center.y);
        }
    rlEnd();

    rlSetTexture(0);
#else
    rlCheckRenderBatchLimit(3*segments);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x, center.y);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);

            angle += stepLength;
        }
    rlEnd();
#endif
}